

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

void __thiscall Connection::queueBind(Connection *this,string *name)

{
  ssize_t sVar1;
  long *plVar2;
  PostmanConnectionException *pPVar3;
  size_type *psVar4;
  uint8_t tag;
  char local_101;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_101 = '\x02';
  if (0xff < name->_M_string_length) {
    pPVar3 = (PostmanConnectionException *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_100,0xff);
    std::operator+(&local_40,"Name must be less than ",&local_100);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
    local_e0._M_dataplus._M_p = (pointer)*plVar2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_e0._M_dataplus._M_p == psVar4) {
      local_e0.field_2._M_allocated_capacity = *psVar4;
      local_e0.field_2._8_8_ = plVar2[3];
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar4;
    }
    local_e0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    PostmanConnectionException::PostmanConnectionException(pPVar3,&local_e0);
    __cxa_throw(pPVar3,&PostmanConnectionException::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::resize((ulong)name,-1);
  sVar1 = write(this->_socket,&local_101,1);
  if (sVar1 < 0) {
    pPVar3 = (PostmanConnectionException *)__cxa_allocate_exception(0x10);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Cannot send binding tag.","");
    PostmanConnectionException::PostmanConnectionException(pPVar3,&local_60);
    __cxa_throw(pPVar3,&PostmanConnectionException::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar1 = write(this->_socket,(name->_M_dataplus)._M_p,0xff);
  if (sVar1 < 0) {
    pPVar3 = (PostmanConnectionException *)__cxa_allocate_exception(0x10);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Cannot send bind name.","")
    ;
    PostmanConnectionException::PostmanConnectionException(pPVar3,&local_80);
    __cxa_throw(pPVar3,&PostmanConnectionException::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar1 = read(this->_socket,&local_101,1);
  if (-1 < sVar1) {
    if (local_101 == '\x03') {
      this->_isBound = true;
      return;
    }
    pPVar3 = (PostmanConnectionException *)__cxa_allocate_exception(0x10);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"The queue doesn\'t exist.","");
    PostmanConnectionException::PostmanConnectionException(pPVar3,&local_c0);
    __cxa_throw(pPVar3,&PostmanConnectionException::typeinfo,std::runtime_error::~runtime_error);
  }
  pPVar3 = (PostmanConnectionException *)__cxa_allocate_exception(0x10);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Didn\'t recieve tag.","");
  PostmanConnectionException::PostmanConnectionException(pPVar3,&local_a0);
  __cxa_throw(pPVar3,&PostmanConnectionException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Connection::queueBind(std::string name) {
  uint8_t tag = static_cast<uint8_t>(MessageTag::queueBind);
  if (name.size() > queueNameSize) {
    throw PostmanConnectionException("Name must be less than " +
                                     std::to_string(queueNameSize) +
                                     " characters.");
  }

  name.resize(queueNameSize);
  if (write(_socket, &tag, 1) < 0) {
    throw PostmanConnectionException("Cannot send binding tag.");
  }

  if (write(_socket, name.data(), queueNameSize) < 0) {
    throw PostmanConnectionException("Cannot send bind name.");
  }

  if (read(_socket, &tag, 1) < 0) {
    throw PostmanConnectionException("Didn't recieve tag.");
  }

  if (MessageTag(tag) == MessageTag::ack) {
    this->_isBound = true;
  } else {
    throw PostmanConnectionException("The queue doesn't exist.");
  }
}